

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_number_table.cpp
# Opt level: O1

size_t __thiscall spvtools::opt::ValueTableHash::operator()(ValueTableHash *this,Instruction *inst)

{
  uint **ppuVar1;
  uint **ppuVar2;
  char32_t __c;
  Operand *pOVar3;
  size_t sVar4;
  uint uVar5;
  uint32_t index;
  char32_t *pcVar6;
  char32_t *pcVar7;
  u32string h;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> local_50;
  
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = L'\0';
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
  push_back(&local_50,inst->opcode_);
  __c = L'\0';
  if (inst->has_type_id_ == true) {
    __c = Instruction::GetSingleWordOperand(inst,0);
  }
  std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
  push_back(&local_50,__c);
  uVar5 = (inst->has_result_id_ & 1) + 1;
  if (inst->has_type_id_ == false) {
    uVar5 = (uint)inst->has_result_id_;
  }
  if (uVar5 != (int)((ulong)((long)(inst->operands_).
                                   super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(inst->operands_).
                                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555) {
    index = 0;
    do {
      pOVar3 = Instruction::GetInOperand(inst,index);
      ppuVar1 = (uint **)(pOVar3->words).large_data_._M_t.
                         super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         .
                         super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                         ._M_head_impl;
      ppuVar2 = &(pOVar3->words).small_data_;
      if (ppuVar1 == (uint **)0x0) {
        pcVar6 = (char32_t *)((pOVar3->words).small_data_ + (pOVar3->words).size_);
      }
      else {
        pcVar6 = *(char32_t **)
                  &((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)(ppuVar1 + 1))->
                   _M_impl;
        ppuVar2 = ppuVar1;
      }
      for (pcVar7 = (char32_t *)*ppuVar2; pcVar7 != pcVar6; pcVar7 = pcVar7 + 1) {
        std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
        ::push_back(&local_50,*pcVar7);
      }
      index = index + 1;
      uVar5 = (inst->has_result_id_ & 1) + 1;
      if (inst->has_type_id_ == false) {
        uVar5 = (uint)inst->has_result_id_;
      }
    } while (index < (int)((ulong)((long)(inst->operands_).
                                         super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(inst->operands_).
                                        super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                     -0x55555555 - uVar5);
  }
  sVar4 = std::_Hash_bytes(local_50._M_dataplus._M_p,local_50._M_string_length << 2,0xc70f6907);
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT44(local_50.field_2._M_local_buf[1],local_50.field_2._M_local_buf[0]) * 4
                    + 4);
  }
  return sVar4;
}

Assistant:

std::size_t ValueTableHash::operator()(const Instruction& inst) const {
  // We hash the opcode and in-operands, not the result, because we want
  // instructions that are the same except for the result to hash to the
  // same value.
  std::u32string h;
  h.push_back(uint32_t(inst.opcode()));
  h.push_back(inst.type_id());
  for (uint32_t i = 0; i < inst.NumInOperands(); ++i) {
    const auto& opnd = inst.GetInOperand(i);
    for (uint32_t word : opnd.words) {
      h.push_back(word);
    }
  }
  return std::hash<std::u32string>()(h);
}